

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int unixGetTempname(int nBuf,char *zBuf)

{
  int iVar1;
  size_t sVar2;
  char *in_RSI;
  int in_EDI;
  char *zDir;
  uint j;
  uint i;
  void *in_stack_000000f8;
  int in_stack_00000104;
  char *local_20;
  uint local_18;
  uint local_14;
  int local_4;
  
  local_20 = unixTempFileDir();
  if (local_20 == (char *)0x0) {
    local_20 = ".";
  }
  sVar2 = strlen(local_20);
  if (sVar2 + 0x19 < (ulong)(long)in_EDI) {
    do {
      sqlite3_snprintf((int)(ulong)(in_EDI - 0x12),in_RSI,"%s/etilqs_",local_20);
      sVar2 = strlen(in_RSI);
      local_18 = (uint)sVar2;
      sqlite3_randomness(in_stack_00000104,in_stack_000000f8);
      for (local_14 = 0; local_14 < 0xf; local_14 = local_14 + 1) {
        in_RSI[local_18] =
             "abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ0123456789"
             [(ulong)(byte)in_RSI[local_18] % 0x3e];
        local_18 = local_18 + 1;
      }
      in_RSI[local_18] = '\0';
      in_RSI[local_18 + 1] = '\0';
      iVar1 = (*aSyscall[2].pCurrent)(in_RSI,0);
    } while (iVar1 == 0);
    local_4 = 0;
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int unixGetTempname(int nBuf, char *zBuf){
  static const unsigned char zChars[] =
    "abcdefghijklmnopqrstuvwxyz"
    "ABCDEFGHIJKLMNOPQRSTUVWXYZ"
    "0123456789";
  unsigned int i, j;
  const char *zDir;

  /* It's odd to simulate an io-error here, but really this is just
  ** using the io-error infrastructure to test that SQLite handles this
  ** function failing. 
  */
  SimulateIOError( return SQLITE_IOERR );

  zDir = unixTempFileDir();
  if( zDir==0 ) zDir = ".";

  /* Check that the output buffer is large enough for the temporary file 
  ** name. If it is not, return SQLITE_ERROR.
  */
  if( (strlen(zDir) + strlen(SQLITE_TEMP_FILE_PREFIX) + 18) >= (size_t)nBuf ){
    return SQLITE_ERROR;
  }

  do{
    sqlite3_snprintf(nBuf-18, zBuf, "%s/"SQLITE_TEMP_FILE_PREFIX, zDir);
    j = (int)strlen(zBuf);
    sqlite3_randomness(15, &zBuf[j]);
    for(i=0; i<15; i++, j++){
      zBuf[j] = (char)zChars[ ((unsigned char)zBuf[j])%(sizeof(zChars)-1) ];
    }
    zBuf[j] = 0;
    zBuf[j+1] = 0;
  }while( osAccess(zBuf,0)==0 );
  return SQLITE_OK;
}